

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

void __thiscall llvm::yaml::Input::scalarTag(Input *this,string *Tag)

{
  string local_38;
  
  Node::getVerbatimTag_abi_cxx11_(&local_38,this->CurrentNode->_node);
  std::__cxx11::string::operator=((string *)Tag,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Input::scalarTag(std::string &Tag) {
  Tag = CurrentNode->_node->getVerbatimTag();
}